

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::anon_unknown_0::FrexpCaseInstance::getInputValues
          (FrexpCaseInstance *this,int numValues,void **values)

{
  float fVar1;
  Precision precision;
  pointer pSVar2;
  void *pvVar3;
  deUint32 dVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  Random rnd;
  float local_58 [6];
  deRandom local_40;
  
  local_58[0] = -2.0;
  local_58[1] = 2.0;
  local_58[2] = -1000.0;
  local_58[3] = 1000.0;
  local_58[4] = -1e+07;
  local_58[5] = 1e+07;
  dVar4 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar4 ^ 0x2790a);
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  precision = *(Precision *)((long)&(pSVar2->varType).m_data + 4);
  uVar5 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  pvVar3 = *values;
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      *(undefined4 *)((long)pvVar3 + uVar8 * 4) = 0;
      iVar7 = (int)uVar8;
      *(undefined4 *)((long)pvVar3 + (long)(int)(uVar5 + iVar7) * 4) = 0x80000000;
      *(undefined4 *)((long)pvVar3 + (long)(int)(uVar5 * 2 + iVar7) * 4) = 0x3f000000;
      *(undefined4 *)((long)pvVar3 + (long)(int)(uVar5 * 3 + iVar7) * 4) = 0xbf000000;
      *(undefined4 *)((long)pvVar3 + (long)(int)(uVar5 * 4 + iVar7) * 4) = 0x3f800000;
      *(undefined4 *)((long)pvVar3 + (long)(int)(uVar5 * 5 + iVar7) * 4) = 0xbf800000;
      *(undefined4 *)((long)pvVar3 + (long)(int)(uVar5 * 6 + iVar7) * 4) = 0x40000000;
      *(undefined4 *)((long)pvVar3 + (long)(int)(uVar5 * 7 + iVar7) * 4) = 0xc0000000;
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  uVar6 = (numValues + -8) * uVar5;
  if (0 < (int)uVar6) {
    fVar12 = local_58[(ulong)precision * 2];
    fVar1 = local_58[(ulong)precision * 2 + 1];
    uVar8 = 0;
    do {
      fVar11 = deRandom_getFloat(&local_40);
      *(float *)((long)pvVar3 + uVar8 * 4 + (long)(int)(uVar5 * 8) * 4) =
           fVar11 * (fVar1 - fVar12) + fVar12;
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (0 < numValues) {
    iVar10 = 0;
    iVar7 = 0;
    do {
      if (0 < (int)uVar5) {
        pvVar3 = *values;
        uVar8 = (ulong)uVar5;
        iVar9 = iVar10;
        do {
          fVar12 = makeFloatRepresentable(*(float *)((long)pvVar3 + (long)iVar9 * 4),precision);
          *(float *)((long)pvVar3 + (long)iVar9 * 4) = fVar12;
          iVar9 = iVar9 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      iVar7 = iVar7 + 1;
      iVar10 = iVar10 + uVar5;
    } while (iVar7 != numValues);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd			(deStringHash(m_name) ^ 0x2790au);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		// Special cases
		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			((float*)values[0])[scalarSize*0 + compNdx] = 0.0f;
			((float*)values[0])[scalarSize*1 + compNdx] = -0.0f;
			((float*)values[0])[scalarSize*2 + compNdx] = 0.5f;
			((float*)values[0])[scalarSize*3 + compNdx] = -0.5f;
			((float*)values[0])[scalarSize*4 + compNdx] = 1.0f;
			((float*)values[0])[scalarSize*5 + compNdx] = -1.0f;
			((float*)values[0])[scalarSize*6 + compNdx] = 2.0f;
			((float*)values[0])[scalarSize*7 + compNdx] = -2.0f;
		}

		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[0] + 8*scalarSize, (numValues-8)*scalarSize);

		// Make sure the values are representable in the target format
		for (int caseNdx = 0; caseNdx < numValues; ++caseNdx)
		{
			for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
			{
				float* const valuePtr = &((float*)values[0])[caseNdx * scalarSize + scalarNdx];

				*valuePtr = makeFloatRepresentable(*valuePtr, precision);
			}
		}
	}